

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O1

void pipe_pinger_new(int vectored_writes)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  pinger_t *pinger;
  int *unaff_RBX;
  int64_t eval_b;
  int64_t eval_a;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  int *piStack_58;
  long local_28;
  
  piVar3 = (int *)malloc(0x168);
  if (piVar3 == (int *)0x0) {
    pipe_pinger_new_cold_3();
LAB_001af68e:
    pipe_pinger_new_cold_1();
  }
  else {
    *piVar3 = vectored_writes;
    piVar3[1] = 0;
    piVar3[2] = 0;
    *(char **)(piVar3 + 0x58) = PING;
    uVar4 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar4,piVar3 + 4,0);
    *(int **)(piVar3 + 4) = piVar3;
    local_28 = (long)iVar1;
    unaff_RBX = piVar3;
    if (local_28 != 0) goto LAB_001af68e;
    unaff_RBX = piVar3 + 0x3e;
    uv_pipe_connect(unaff_RBX,piVar3 + 4,"/tmp/uv-test-sock",pinger_on_connect);
    local_28 = (long)pinger_on_connect_count;
    if (local_28 == 0) {
      return;
    }
  }
  iVar1 = (int)&local_28;
  pipe_pinger_new_cold_2();
  piStack_58 = unaff_RBX;
  iVar2 = uv_pipe(&uStack_60,0x40,0x40);
  if (iVar2 == 0) {
    iVar2 = uv_guess_handle(uStack_60);
    if (iVar2 != 7) goto LAB_001af88b;
    iVar2 = uv_guess_handle(uStack_5c);
    if (iVar2 != 7) goto LAB_001af898;
    puVar5 = (undefined8 *)malloc(0xe8);
    if (puVar5 == (undefined8 *)0x0) goto LAB_001af8a5;
    uVar4 = uv_default_loop();
    iVar2 = uv_pipe_init(uVar4,puVar5,0);
    if (iVar2 != 0) goto LAB_001af8aa;
    iVar2 = uv_pipe_open(puVar5,uStack_60);
    if (iVar2 != 0) goto LAB_001af8b7;
    pinger = (pinger_t *)malloc(0x168);
    if (pinger == (pinger_t *)0x0) goto LAB_001af8c4;
    pinger->vectored_writes = iVar1;
    pinger->pongs = 0;
    pinger->state = 0;
    pinger->pong = PING;
    uVar4 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar4,&pinger->stream,0);
    if (iVar1 != 0) goto LAB_001af8c9;
    iVar1 = uv_pipe_open(&pinger->stream,uStack_5c);
    if (iVar1 == 0) {
      (pinger->stream).tcp.data = pinger;
      *puVar5 = pinger;
      pinger_write_ping(pinger);
      iVar1 = uv_read_start(puVar5,alloc_cb,pinger_read_cb);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_001af8e3;
    }
  }
  else {
    pipe2_pinger_new_cold_1();
LAB_001af88b:
    pipe2_pinger_new_cold_2();
LAB_001af898:
    pipe2_pinger_new_cold_3();
LAB_001af8a5:
    pipe2_pinger_new_cold_10();
LAB_001af8aa:
    pipe2_pinger_new_cold_4();
LAB_001af8b7:
    pipe2_pinger_new_cold_5();
LAB_001af8c4:
    pipe2_pinger_new_cold_9();
LAB_001af8c9:
    pipe2_pinger_new_cold_6();
  }
  pipe2_pinger_new_cold_7();
LAB_001af8e3:
  pipe2_pinger_new_cold_8();
  pipe_pinger_new(1);
  run_ping_pong_test();
  completed_pingers = 0;
  pipe2_pinger_new(1);
  run_ping_pong_test();
  return;
}

Assistant:

static void pipe_pinger_new(int vectored_writes) {
  int r;
  pinger_t* pinger;

  pinger = malloc(sizeof(*pinger));
  ASSERT_NOT_NULL(pinger);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;
  pinger->pong = PING;

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_pipe_init(uv_default_loop(), &pinger->stream.pipe, 0);
  pinger->stream.pipe.data = pinger;
  ASSERT_OK(r);

  /* We are never doing multiple reads/connects at a time anyway, so these
   * handles can be pre-initialized. */
  uv_pipe_connect(&pinger->connect_req, &pinger->stream.pipe, TEST_PIPENAME,
      pinger_on_connect);

  /* Synchronous connect callbacks are not allowed. */
  ASSERT_OK(pinger_on_connect_count);
}